

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image_simd.cpp
# Opt level: O3

void compute_padded_integral_img_int(uint8_t *gray_image,integral_image *iimage)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  float *pfVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  byte bVar22;
  byte bVar23;
  uint uVar24;
  float *pfVar25;
  long lVar26;
  int i;
  float fVar27;
  uint8_t *puVar28;
  long lVar29;
  int iVar30;
  long lVar31;
  float *pfVar32;
  long lVar33;
  ulong uVar34;
  float *pfVar35;
  long lVar36;
  int iVar37;
  ulong uVar38;
  int iVar39;
  ushort uVar40;
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  
  pfVar5 = iimage->padded_data;
  uVar1 = iimage->data_width;
  uVar2 = iimage->height;
  lVar36 = (long)(int)uVar1;
  iVar3 = iimage->data_height;
  uVar4 = iimage->width;
  iVar39 = uVar1 - uVar4;
  uVar24 = iVar39 / 2;
  uVar38 = (ulong)uVar24;
  if (1 < iVar39) {
    uVar34 = 0;
    do {
      if (0 < (int)uVar1) {
        memset(pfVar5 + uVar34,0,(ulong)uVar1 * 4);
      }
      uVar34 = (ulong)((int)uVar34 + uVar1);
      uVar38 = uVar38 - 1;
    } while (uVar38 != 0);
  }
  if ((int)uVar24 < iVar3) {
    iVar30 = uVar1 * uVar24;
    iVar37 = iVar3 - uVar24;
    do {
      if (1 < iVar39) {
        memset(pfVar5 + iVar30,0,(ulong)(uVar24 - 1) * 4 + 4);
      }
      iVar30 = iVar30 + uVar1;
      iVar37 = iVar37 + -1;
    } while (iVar37 != 0);
  }
  pfVar25 = iimage->data;
  if (0 < (int)uVar4) {
    uVar38 = 0;
    fVar27 = 0.0;
    do {
      fVar27 = (float)((int)fVar27 + (uint)gray_image[uVar38]);
      pfVar25[uVar38] = fVar27;
      uVar38 = uVar38 + 1;
    } while (uVar4 != uVar38);
  }
  if (1 < (int)uVar2) {
    puVar28 = gray_image + (int)uVar4;
    uVar38 = 1;
    pfVar32 = pfVar25;
    pfVar35 = pfVar25;
    do {
      pfVar35 = pfVar35 + lVar36;
      if (0 < (int)uVar4) {
        uVar34 = 0;
        iVar39 = 0;
        do {
          iVar39 = iVar39 + (uint)puVar28[uVar34];
          pfVar35[uVar34] = (float)((int)pfVar32[uVar34] + iVar39);
          uVar34 = uVar34 + 1;
        } while (uVar4 != uVar34);
      }
      uVar38 = uVar38 + 1;
      pfVar32 = pfVar32 + lVar36;
      puVar28 = puVar28 + (int)uVar4;
    } while (uVar38 != uVar2);
  }
  if (0 < (int)uVar2) {
    auVar41 = vbroadcastss_avx512f(ZEXT416(0x3b808081));
    auVar42 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar43 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    uVar38 = 0;
    auVar44 = vpbroadcastq_avx512f();
    do {
      if (0 < (int)uVar4) {
        uVar34 = 0;
        do {
          auVar45 = vpbroadcastq_avx512f();
          auVar46 = vporq_avx512f(auVar45,auVar42);
          auVar45 = vporq_avx512f(auVar45,auVar43);
          uVar20 = vpcmpuq_avx512f(auVar45,auVar44,2);
          bVar22 = (byte)uVar20;
          uVar20 = vpcmpuq_avx512f(auVar46,auVar44,2);
          bVar23 = (byte)uVar20;
          uVar40 = CONCAT11(bVar23,bVar22);
          auVar45 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pfVar25 + uVar34));
          auVar46._4_4_ = (uint)((byte)(uVar40 >> 1) & 1) * auVar45._4_4_;
          auVar46._0_4_ = (uint)(bVar22 & 1) * auVar45._0_4_;
          auVar46._8_4_ = (uint)((byte)(uVar40 >> 2) & 1) * auVar45._8_4_;
          auVar46._12_4_ = (uint)((byte)(uVar40 >> 3) & 1) * auVar45._12_4_;
          auVar46._16_4_ = (uint)((byte)(uVar40 >> 4) & 1) * auVar45._16_4_;
          auVar46._20_4_ = (uint)((byte)(uVar40 >> 5) & 1) * auVar45._20_4_;
          auVar46._24_4_ = (uint)((byte)(uVar40 >> 6) & 1) * auVar45._24_4_;
          auVar46._28_4_ = (uint)((byte)(uVar40 >> 7) & 1) * auVar45._28_4_;
          auVar46._32_4_ = (uint)(bVar23 & 1) * auVar45._32_4_;
          auVar46._36_4_ = (uint)(bVar23 >> 1 & 1) * auVar45._36_4_;
          auVar46._40_4_ = (uint)(bVar23 >> 2 & 1) * auVar45._40_4_;
          auVar46._44_4_ = (uint)(bVar23 >> 3 & 1) * auVar45._44_4_;
          auVar46._48_4_ = (uint)(bVar23 >> 4 & 1) * auVar45._48_4_;
          auVar46._52_4_ = (uint)(bVar23 >> 5 & 1) * auVar45._52_4_;
          auVar46._56_4_ = (uint)(bVar23 >> 6 & 1) * auVar45._56_4_;
          auVar46._60_4_ = (uint)(bVar23 >> 7) * auVar45._60_4_;
          auVar45 = vcvtudq2ps_avx512f(auVar46);
          auVar45 = vmulps_avx512f(auVar45,auVar41);
          pfVar35 = pfVar25 + uVar34;
          bVar6 = (bool)((byte)(uVar40 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar40 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar40 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar40 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar40 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar40 >> 6) & 1);
          bVar12 = (bool)((byte)(uVar40 >> 7) & 1);
          bVar13 = (bool)(bVar23 >> 1 & 1);
          bVar14 = (bool)(bVar23 >> 2 & 1);
          bVar15 = (bool)(bVar23 >> 3 & 1);
          bVar16 = (bool)(bVar23 >> 4 & 1);
          bVar17 = (bool)(bVar23 >> 5 & 1);
          bVar18 = (bool)(bVar23 >> 6 & 1);
          *pfVar35 = (float)((uint)(bVar22 & 1) * auVar45._0_4_ |
                            (uint)!(bool)(bVar22 & 1) * (int)*pfVar35);
          pfVar35[1] = (float)((uint)bVar6 * auVar45._4_4_ | (uint)!bVar6 * (int)pfVar35[1]);
          pfVar35[2] = (float)((uint)bVar7 * auVar45._8_4_ | (uint)!bVar7 * (int)pfVar35[2]);
          pfVar35[3] = (float)((uint)bVar8 * auVar45._12_4_ | (uint)!bVar8 * (int)pfVar35[3]);
          pfVar35[4] = (float)((uint)bVar9 * auVar45._16_4_ | (uint)!bVar9 * (int)pfVar35[4]);
          pfVar35[5] = (float)((uint)bVar10 * auVar45._20_4_ | (uint)!bVar10 * (int)pfVar35[5]);
          pfVar35[6] = (float)((uint)bVar11 * auVar45._24_4_ | (uint)!bVar11 * (int)pfVar35[6]);
          pfVar35[7] = (float)((uint)bVar12 * auVar45._28_4_ | (uint)!bVar12 * (int)pfVar35[7]);
          pfVar35[8] = (float)((uint)(bVar23 & 1) * auVar45._32_4_ |
                              (uint)!(bool)(bVar23 & 1) * (int)pfVar35[8]);
          pfVar35[9] = (float)((uint)bVar13 * auVar45._36_4_ | (uint)!bVar13 * (int)pfVar35[9]);
          pfVar35[10] = (float)((uint)bVar14 * auVar45._40_4_ | (uint)!bVar14 * (int)pfVar35[10]);
          pfVar35[0xb] = (float)((uint)bVar15 * auVar45._44_4_ | (uint)!bVar15 * (int)pfVar35[0xb]);
          pfVar35[0xc] = (float)((uint)bVar16 * auVar45._48_4_ | (uint)!bVar16 * (int)pfVar35[0xc]);
          pfVar35[0xd] = (float)((uint)bVar17 * auVar45._52_4_ | (uint)!bVar17 * (int)pfVar35[0xd]);
          pfVar35[0xe] = (float)((uint)bVar18 * auVar45._56_4_ | (uint)!bVar18 * (int)pfVar35[0xe]);
          pfVar35[0xf] = (float)((uint)(bVar23 >> 7) * auVar45._60_4_ |
                                (uint)!(bool)(bVar23 >> 7) * (int)pfVar35[0xf]);
          uVar34 = uVar34 + 0x10;
        } while ((uVar4 + 0xf & 0xfffffff0) != uVar34);
      }
      uVar38 = uVar38 + 1;
      pfVar25 = pfVar25 + lVar36;
    } while (uVar38 != uVar2);
    if (0 < (int)uVar2) {
      iVar39 = uVar24 + uVar4;
      lVar31 = (long)(int)uVar24;
      auVar41 = vpbroadcastq_avx512f();
      pfVar25 = pfVar5 + lVar36 * lVar31 + (long)iVar39;
      do {
        if (iVar39 < (int)uVar1) {
          auVar44 = vbroadcastss_avx512f
                              (ZEXT416((uint)pfVar5[(long)(int)((int)lVar31 * uVar1 + iVar39) + -1])
                              );
          uVar38 = 0;
          do {
            auVar45 = vpbroadcastq_avx512f();
            auVar46 = vporq_avx512f(auVar45,auVar42);
            auVar45 = vporq_avx512f(auVar45,auVar43);
            uVar20 = vpcmpuq_avx512f(auVar45,auVar41,2);
            uVar21 = vpcmpuq_avx512f(auVar46,auVar41,2);
            bVar22 = (byte)uVar21;
            uVar40 = CONCAT11(bVar22,(byte)uVar20);
            pfVar35 = pfVar25 + uVar38;
            bVar6 = (bool)((byte)uVar20 & 1);
            bVar7 = (bool)((byte)(uVar40 >> 1) & 1);
            bVar8 = (bool)((byte)(uVar40 >> 2) & 1);
            bVar9 = (bool)((byte)(uVar40 >> 3) & 1);
            bVar10 = (bool)((byte)(uVar40 >> 4) & 1);
            bVar11 = (bool)((byte)(uVar40 >> 5) & 1);
            bVar12 = (bool)((byte)(uVar40 >> 6) & 1);
            bVar13 = (bool)((byte)(uVar40 >> 7) & 1);
            bVar14 = (bool)(bVar22 >> 1 & 1);
            bVar15 = (bool)(bVar22 >> 2 & 1);
            bVar16 = (bool)(bVar22 >> 3 & 1);
            bVar17 = (bool)(bVar22 >> 4 & 1);
            bVar18 = (bool)(bVar22 >> 5 & 1);
            bVar19 = (bool)(bVar22 >> 6 & 1);
            *pfVar35 = (float)((uint)bVar6 * auVar44._0_4_ | (uint)!bVar6 * (int)*pfVar35);
            pfVar35[1] = (float)((uint)bVar7 * auVar44._4_4_ | (uint)!bVar7 * (int)pfVar35[1]);
            pfVar35[2] = (float)((uint)bVar8 * auVar44._8_4_ | (uint)!bVar8 * (int)pfVar35[2]);
            pfVar35[3] = (float)((uint)bVar9 * auVar44._12_4_ | (uint)!bVar9 * (int)pfVar35[3]);
            pfVar35[4] = (float)((uint)bVar10 * auVar44._16_4_ | (uint)!bVar10 * (int)pfVar35[4]);
            pfVar35[5] = (float)((uint)bVar11 * auVar44._20_4_ | (uint)!bVar11 * (int)pfVar35[5]);
            pfVar35[6] = (float)((uint)bVar12 * auVar44._24_4_ | (uint)!bVar12 * (int)pfVar35[6]);
            pfVar35[7] = (float)((uint)bVar13 * auVar44._28_4_ | (uint)!bVar13 * (int)pfVar35[7]);
            pfVar35[8] = (float)((uint)(bVar22 & 1) * auVar44._32_4_ |
                                (uint)!(bool)(bVar22 & 1) * (int)pfVar35[8]);
            pfVar35[9] = (float)((uint)bVar14 * auVar44._36_4_ | (uint)!bVar14 * (int)pfVar35[9]);
            pfVar35[10] = (float)((uint)bVar15 * auVar44._40_4_ | (uint)!bVar15 * (int)pfVar35[10]);
            pfVar35[0xb] = (float)((uint)bVar16 * auVar44._44_4_ | (uint)!bVar16 * (int)pfVar35[0xb]
                                  );
            pfVar35[0xc] = (float)((uint)bVar17 * auVar44._48_4_ | (uint)!bVar17 * (int)pfVar35[0xc]
                                  );
            pfVar35[0xd] = (float)((uint)bVar18 * auVar44._52_4_ | (uint)!bVar18 * (int)pfVar35[0xd]
                                  );
            pfVar35[0xe] = (float)((uint)bVar19 * auVar44._56_4_ | (uint)!bVar19 * (int)pfVar35[0xe]
                                  );
            pfVar35[0xf] = (float)((uint)(bVar22 >> 7) * auVar44._60_4_ |
                                  (uint)!(bool)(bVar22 >> 7) * (int)pfVar35[0xf]);
            uVar38 = uVar38 + 0x10;
          } while (((lVar36 - iVar39) + 0xfU & 0xfffffffffffffff0) != uVar38);
        }
        lVar31 = lVar31 + 1;
        pfVar25 = pfVar25 + lVar36;
      } while (lVar31 < (int)(uVar24 + uVar2));
    }
  }
  iVar39 = uVar24 + uVar2;
  if (iVar39 < iVar3) {
    lVar26 = (long)iVar39;
    iVar30 = uVar24 + uVar4;
    lVar33 = (long)iVar30;
    pfVar25 = pfVar5 + lVar26 * lVar36;
    pfVar35 = pfVar5 + (lVar26 + -1) * lVar36;
    lVar31 = lVar26;
    do {
      lVar29 = (long)(int)uVar24;
      if (0 < (int)uVar4) {
        do {
          pfVar25[lVar29] = pfVar35[lVar29];
          lVar29 = lVar29 + 1;
        } while (lVar29 < lVar33);
      }
      lVar31 = lVar31 + 1;
      pfVar25 = pfVar25 + lVar36;
      pfVar35 = pfVar35 + lVar36;
    } while (lVar31 < iVar3);
    if (iVar39 < iVar3) {
      auVar41 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar42 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar43 = vpbroadcastq_avx512f();
      pfVar25 = pfVar5 + lVar26 * lVar36 + lVar33;
      auVar44 = vbroadcastss_avx512f
                          (ZEXT416((uint)pfVar5[(long)(int)(uVar1 * (iVar39 + -1) + iVar30) + -1]));
      do {
        if (iVar30 < (int)uVar1) {
          uVar38 = 0;
          do {
            auVar45 = vpbroadcastq_avx512f();
            auVar46 = vporq_avx512f(auVar45,auVar41);
            auVar45 = vporq_avx512f(auVar45,auVar42);
            uVar20 = vpcmpuq_avx512f(auVar45,auVar43,2);
            uVar21 = vpcmpuq_avx512f(auVar46,auVar43,2);
            bVar22 = (byte)uVar21;
            uVar40 = CONCAT11(bVar22,(byte)uVar20);
            pfVar5 = pfVar25 + uVar38;
            bVar6 = (bool)((byte)uVar20 & 1);
            bVar7 = (bool)((byte)(uVar40 >> 1) & 1);
            bVar8 = (bool)((byte)(uVar40 >> 2) & 1);
            bVar9 = (bool)((byte)(uVar40 >> 3) & 1);
            bVar10 = (bool)((byte)(uVar40 >> 4) & 1);
            bVar11 = (bool)((byte)(uVar40 >> 5) & 1);
            bVar12 = (bool)((byte)(uVar40 >> 6) & 1);
            bVar13 = (bool)((byte)(uVar40 >> 7) & 1);
            bVar14 = (bool)(bVar22 >> 1 & 1);
            bVar15 = (bool)(bVar22 >> 2 & 1);
            bVar16 = (bool)(bVar22 >> 3 & 1);
            bVar17 = (bool)(bVar22 >> 4 & 1);
            bVar18 = (bool)(bVar22 >> 5 & 1);
            bVar19 = (bool)(bVar22 >> 6 & 1);
            *pfVar5 = (float)((uint)bVar6 * auVar44._0_4_ | (uint)!bVar6 * (int)*pfVar5);
            pfVar5[1] = (float)((uint)bVar7 * auVar44._4_4_ | (uint)!bVar7 * (int)pfVar5[1]);
            pfVar5[2] = (float)((uint)bVar8 * auVar44._8_4_ | (uint)!bVar8 * (int)pfVar5[2]);
            pfVar5[3] = (float)((uint)bVar9 * auVar44._12_4_ | (uint)!bVar9 * (int)pfVar5[3]);
            pfVar5[4] = (float)((uint)bVar10 * auVar44._16_4_ | (uint)!bVar10 * (int)pfVar5[4]);
            pfVar5[5] = (float)((uint)bVar11 * auVar44._20_4_ | (uint)!bVar11 * (int)pfVar5[5]);
            pfVar5[6] = (float)((uint)bVar12 * auVar44._24_4_ | (uint)!bVar12 * (int)pfVar5[6]);
            pfVar5[7] = (float)((uint)bVar13 * auVar44._28_4_ | (uint)!bVar13 * (int)pfVar5[7]);
            pfVar5[8] = (float)((uint)(bVar22 & 1) * auVar44._32_4_ |
                               (uint)!(bool)(bVar22 & 1) * (int)pfVar5[8]);
            pfVar5[9] = (float)((uint)bVar14 * auVar44._36_4_ | (uint)!bVar14 * (int)pfVar5[9]);
            pfVar5[10] = (float)((uint)bVar15 * auVar44._40_4_ | (uint)!bVar15 * (int)pfVar5[10]);
            pfVar5[0xb] = (float)((uint)bVar16 * auVar44._44_4_ | (uint)!bVar16 * (int)pfVar5[0xb]);
            pfVar5[0xc] = (float)((uint)bVar17 * auVar44._48_4_ | (uint)!bVar17 * (int)pfVar5[0xc]);
            pfVar5[0xd] = (float)((uint)bVar18 * auVar44._52_4_ | (uint)!bVar18 * (int)pfVar5[0xd]);
            pfVar5[0xe] = (float)((uint)bVar19 * auVar44._56_4_ | (uint)!bVar19 * (int)pfVar5[0xe]);
            pfVar5[0xf] = (float)((uint)(bVar22 >> 7) * auVar44._60_4_ |
                                 (uint)!(bool)(bVar22 >> 7) * (int)pfVar5[0xf]);
            uVar38 = uVar38 + 0x10;
          } while (((lVar36 - lVar33) + 0xfU & 0xfffffffffffffff0) != uVar38);
        }
        lVar26 = lVar26 + 1;
        pfVar25 = pfVar25 + lVar36;
      } while (lVar26 < iVar3);
    }
  }
  return;
}

Assistant:

void compute_padded_integral_img_int(uint8_t *gray_image, struct integral_image *iimage) {

    float *iimage_padded_data = iimage->padded_data;
   
    int data_width = iimage->data_width;
    int data_height = iimage->data_height;
    int width = iimage->width;
    int height = iimage->height;

    int border = (data_width - width) / 2; 
    //int border = PADDING_SIZE;

    // Block layout of padded integral image:
    // AAA
    // BIC
    // BDE

    // BLOCK A
    for (int j = 0; j < border; ++j) {
        for (int i = 0; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = 0.0f;
        }
    }

    // BLOCK B
    for (int j = border; j < data_height; ++j) {
        for (int i = 0; i < border; ++i) {
            iimage_padded_data[j * data_width + i] = 0.0f;
        }
    }

    // BLOCK I
    {
        uint32_t *iimage_idata = (uint32_t *) iimage->data;

        uint32_t row_sum = 0;

        /* sum up the first row */
        for (int i = 0; i < width; ++i) {
            /* previous rows are 0 */
            row_sum += gray_image[i];
            iimage_idata[i] = row_sum;
        }

        /* sum all remaining rows*/
        for (int j = 1; j < height; ++j) {
            row_sum = 0;
            for (int i = 0; i < width; ++i) {
                row_sum += gray_image[j * width + i];
                /*add sum of current row until current idx to sum of all previous rows until current index */
                iimage_idata[j * data_width + i] = row_sum + iimage_idata[(j - 1) * data_width + i];
            }
        }

        // Converting uint32_t to floats by casting them and multiplying with (1.0f/255.0f)
        float *iimage_data = iimage->data;
        for (int j = 0; j < height; ++j) {
            for (int i = 0; i < width; ++i) {
                //iimage_data[j * data_width + i] = (1.0f / 255.0f) * ((float) iimage_idata[j * data_width + i]);
                iimage_data[j * data_width + i] = (1.0f / 255.0f) * ((float) iimage_idata[j * data_width + i]);
                //iimage_data[j * data_width + i] = ((float) iimage_idata[j * data_width + i]) / 255.0f;
            }
        }
    
    }

    // BLOCK C
    for (int j = border; j < border + height; ++j) {
        float last_element_in_row = iimage_padded_data[j * data_width + border + width - 1]; // TODO: Check if this is correct
        for (int i = width + border; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = last_element_in_row;
        }
    }

    // BLOCK D
    for (int j = border + height; j < data_height; ++j) {
        for (int i = border; i < width + border; ++i) {
            iimage_padded_data[j * data_width + i] = iimage_padded_data[(j-1) * data_width + i];
        }
    }

    // BLOCK E
    int index_last_element = (border + height - 1) * data_width + border + width - 1;
    float max_value = iimage_padded_data[index_last_element];
    for (int j = border + height; j < data_height; ++j) {
        for (int i = border + width; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = max_value;
        }
    }

}